

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_work.hpp
# Opt level: O0

void __thiscall
asio::detail::
handler_work<helics::MessageTimer::updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)::$_0,asio::any_io_executor,void>
::
complete<asio::detail::binder1<helics::MessageTimer::updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)::__0,std::error_code>>
          (handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor,_void>
           *this,binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_std::error_code>
                 *function,type *handler)

{
  bool bVar1;
  handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void> *in_RDI;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_std::error_code>
  *in_stack_ffffffffffffffd8;
  
  bVar1 = handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
          owns_work((handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                     *)0x6931b2);
  if (bVar1) {
    handler_work_base<asio::any_io_executor,void,asio::io_context,asio::executor,void>::
    dispatch<asio::detail::binder1<helics::MessageTimer::updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)::__0,std::error_code>,helics::MessageTimer::updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)::__0>
              (in_RDI,in_stack_ffffffffffffffd8,(type *)0x6931d6);
  }
  else {
    binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_std::error_code>
    ::operator()((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_std::error_code>
                  *)0x6931c0);
  }
  return;
}

Assistant:

void complete(Function& function, Handler& handler)
  {
    if (!base1_type::owns_work())
    {
      // When using a native implementation, I/O completion handlers are
      // already dispatched according to the execution context's executor's
      // rules. We can call the function directly.
      static_cast<Function&&>(function)();
    }
    else
    {
      base1_type::dispatch(function, handler);
    }
  }